

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_grammar_impl
          (llama_vocab *vocab,char *grammar_str,char *grammar_root,bool lazy,char **trigger_words,
          size_t num_trigger_words,llama_token *trigger_tokens,size_t num_trigger_tokens,
          char **trigger_patterns,size_t num_trigger_patterns)

{
  int iVar1;
  char *pcVar2;
  llama_sampler *plVar3;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 in_RDI;
  long in_R8;
  ulong in_R9;
  llama_sampler_grammar *in_stack_00000008;
  llama_sampler_grammar *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  char *trigger_pattern_c;
  size_t i;
  string trigger_pattern;
  llama_sampler_grammar *ctx;
  llama_sampler_grammar *in_stack_fffffffffffffe48;
  llama_sampler_grammar *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *paVar4;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string asStack_128 [32];
  undefined8 local_108;
  undefined1 local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  undefined8 local_f8;
  char local_f0 [64];
  llama_grammar *local_b0;
  undefined8 local_a8;
  string local_a0 [32];
  ulong local_80;
  allocator<char> local_61;
  string local_60 [32];
  char *local_40;
  ulong local_38;
  long local_30;
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined8 local_10;
  
  local_21 = in_CL & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = (char *)operator_new(0x50);
  llama_sampler_grammar::llama_sampler_grammar(in_stack_fffffffffffffe50);
  local_40 = pcVar2;
  if ((local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (local_18->_M_dataplus == (_Alloc_hider)0x0)) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8);
    std::__cxx11::string::string(asStack_128);
    local_108 = 0;
    llama_sampler_grammar::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    llama_sampler_grammar::~llama_sampler_grammar(in_stack_fffffffffffffe50);
  }
  else {
    if ((local_30 != 0) && (local_38 != 0)) {
      if ((in_stack_00000018 != 0) || (in_stack_00000020 != 0)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
                   ,0x5fc,"GGML_ASSERT(%s) failed",
                   "trigger_patterns == nullptr && num_trigger_patterns == 0");
      }
      paVar4 = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<char>::~allocator(&local_61);
      for (local_80 = 0; local_80 < local_38; local_80 = local_80 + 1) {
        if ((llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
             ::special_chars_abi_cxx11_ == '\0') &&
           (iVar1 = __cxa_guard_acquire(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                                         ::special_chars_abi_cxx11_), iVar1 != 0)) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (flag_type)((ulong)in_stack_fffffffffffffe80 >> 0x20));
          __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                       ~basic_regex,
                       &llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                        ::special_chars_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                               ::special_chars_abi_cxx11_);
        }
        if (local_80 != 0) {
          std::__cxx11::string::operator+=(local_60,"|");
        }
        std::regex_replace<std::__cxx11::regex_traits<char>,char>
                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,pcVar2,
                   (match_flag_type)((ulong)paVar4 >> 0x20));
        std::__cxx11::string::operator+=(local_60,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      std::__cxx11::string::operator+=(local_60,")[\\s\\S]*");
      local_a8 = std::__cxx11::string::c_str();
      in_stack_00000020 = 1;
      std::__cxx11::string::~string(local_60);
    }
    local_f8 = local_10;
    pcVar2 = local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_18,pcVar2,in_stack_fffffffffffffe80);
    local_fb = 1;
    paVar4 = &local_fa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_18,pcVar2,paVar4);
    local_b0 = llama_grammar_init_impl
                         (vocab,grammar_str,grammar_root,lazy,trigger_words,num_trigger_words,
                          trigger_tokens,num_trigger_tokens);
    local_fb = 0;
    llama_sampler_grammar::operator=(in_stack_00000010,in_stack_00000008);
    llama_sampler_grammar::~llama_sampler_grammar(in_stack_00000010);
    std::allocator<char>::~allocator(&local_fa);
    std::allocator<char>::~allocator(&local_f9);
    pcVar2 = local_40;
    in_stack_fffffffffffffe48 = in_stack_00000008;
    in_stack_fffffffffffffe50 = in_stack_00000010;
    if (*(long *)(local_40 + 0x48) == 0) {
      if (local_40 != (char *)0x0) {
        llama_sampler_grammar::~llama_sampler_grammar(in_stack_00000010);
        operator_delete(pcVar2,0x50);
      }
      return (llama_sampler *)0x0;
    }
  }
  plVar3 = llama_sampler_init((llama_sampler_i *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                             );
  return plVar3;
}

Assistant:

static struct llama_sampler * llama_sampler_init_grammar_impl(
        const struct llama_vocab * vocab,
                      const char * grammar_str,
                      const char * grammar_root,
                              bool lazy,
                     const char ** trigger_words,
                            size_t num_trigger_words,
               const llama_token * trigger_tokens,
                            size_t num_trigger_tokens,
                     const char ** trigger_patterns,
                            size_t num_trigger_patterns) {
    auto * ctx = new llama_sampler_grammar;

    if (grammar_str != nullptr && grammar_str[0] != '\0') {
        // TODO: remove trigger_words support.
        if (trigger_words != nullptr && num_trigger_words > 0) {
            GGML_ASSERT(trigger_patterns == nullptr && num_trigger_patterns == 0);
            std::string trigger_pattern("[\\s\\S]*?(");
            for (size_t i = 0; i < num_trigger_words; ++i) {
                static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
                if (i > 0) {
                    trigger_pattern += "|";
                }
                trigger_pattern += std::regex_replace(trigger_words[i], special_chars, "\\$0");
            }
            trigger_pattern += ")[\\s\\S]*";
            auto trigger_pattern_c = trigger_pattern.c_str();
            trigger_patterns = &trigger_pattern_c;
            num_trigger_patterns = 1;
        }
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ grammar_str,
            /* .grammar_root = */ grammar_root,
            /* .grammar      = */ llama_grammar_init_impl(vocab, grammar_str, grammar_root, lazy, trigger_patterns, num_trigger_patterns, trigger_tokens, num_trigger_tokens),
        };
        if (!ctx->grammar) {
            delete ctx;
            return nullptr;
        }
    } else {
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ {},
            /* .grammar_root = */ {},
            /* .grammar      = */ nullptr,
        };
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_grammar_i,
        /* .ctx   = */ ctx
    );
}